

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::mousePressEvent(QMenu *this,QMouseEvent *e)

{
  QMenuPrivate *this_00;
  QWidgetData *pQVar1;
  Data *pDVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  QAction *action;
  uint uVar9;
  undefined8 uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  QPoint local_58;
  QPoint local_50;
  QPoint local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->field_0x421 & 1) != 0) goto LAB_00465145;
  bVar4 = QMenuPrivate::mouseEventTaken(this_00,e);
  if (bVar4) goto LAB_00465145;
  uVar6 = QEventPoint::position();
  auVar20._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar20._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar20 = minpd(_DAT_0066f5d0,auVar20);
  auVar20 = maxpd(auVar20,_DAT_0066f5e0);
  auVar21._0_4_ = -(uint)((int)auVar20._0_8_ == 0);
  auVar21._4_4_ = -(uint)((int)auVar20._0_8_ == 0);
  auVar21._8_4_ = -(uint)((int)auVar20._8_8_ == 0);
  auVar21._12_4_ = -(uint)((int)auVar20._8_8_ == 0);
  iVar7 = movmskpd(uVar6,auVar21);
  if (iVar7 == 3) {
    auVar20 = QEventPoint::globalPosition();
    if ((((auVar20._0_8_ == 0.0) && (!NAN(auVar20._0_8_))) && (auVar20._8_8_ == 0.0)) &&
       (!NAN(auVar20._8_8_))) goto LAB_00464e2b;
  }
  else {
LAB_00464e2b:
    pQVar1 = (this->super_QWidget).data;
    uVar10 = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                      (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
    local_48.xp.m_i = 0;
    local_48.yp.m_i = 0;
    local_40 = uVar10;
    auVar20 = QEventPoint::position();
    auVar12._0_8_ =
         (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._8_8_;
    auVar12._8_8_ =
         (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._0_8_;
    auVar20 = minpd(_DAT_0066f5d0,auVar12);
    auVar13._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
    auVar13._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
    uVar9 = movmskpd((int)uVar10,auVar13);
    uVar11 = (ulong)(uint)(int)auVar20._8_8_;
    uVar8 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
    if ((uVar9 & 1) == 0) {
      uVar8 = 0x8000000000000000;
    }
    if ((uVar9 & 2) == 0) {
      uVar11 = 0x80000000;
    }
    local_50 = (QPoint)(uVar11 | uVar8);
    cVar5 = QRect::contains(&local_48,SUB81(&local_50,0));
    if (cVar5 != '\0') {
      auVar20 = QEventPoint::globalPosition();
      auVar14._0_8_ =
           (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._8_8_;
      auVar14._8_8_ =
           (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._0_8_;
      auVar20 = minpd(_DAT_0066f5d0,auVar14);
      auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
      auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
      uVar9 = movmskpd(uVar9,auVar15);
      uVar11 = (ulong)(uint)(int)auVar20._8_8_;
      uVar8 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
      if ((uVar9 & 1) == 0) {
        uVar8 = 0x8000000000000000;
      }
      if ((uVar9 & 2) == 0) {
        uVar11 = 0x80000000;
      }
      local_58 = (QPoint)(uVar11 | uVar8);
      bVar4 = QMenuPrivate::hasMouseMoved(this_00,&local_58);
      if (bVar4) {
        QMenuPrivate::mouseDown = this;
        auVar20 = QEventPoint::position();
        auVar16._0_8_ =
             (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar20._8_8_;
        auVar16._8_8_ =
             (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar20._0_8_;
        auVar20 = minpd(_DAT_0066f5d0,auVar16);
        auVar17._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
        auVar17._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
        uVar9 = movmskpd(uVar9,auVar17);
        uVar8 = 0x8000000000000000;
        if ((uVar9 & 1) != 0) {
          uVar8 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
        }
        uVar11 = 0x80000000;
        if ((uVar9 & 2) != 0) {
          uVar11 = (ulong)(uint)(int)auVar20._8_8_;
        }
        action = QMenuPrivate::actionAt(this_00,(QPoint)(uVar11 | uVar8));
        QMenuPrivate::setCurrentAction(this_00,action,0x14,SelectedFromElsewhere,false);
        QWidget::update(&this->super_QWidget);
        goto LAB_00465145;
      }
    }
  }
  pDVar2 = (this_00->noReplayFor).wp.d;
  if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
     ((this_00->noReplayFor).wp.value != (QObject *)0x0)) {
    local_50.xp.m_i = 0;
    local_50.yp.m_i = 0;
    local_48 = QWidget::mapToGlobal((QWidget *)(this_00->noReplayFor).wp.value,&local_50);
    lVar3 = *(long *)((this_00->noReplayFor).wp.value + 0x20);
    local_40 = CONCAT44((*(int *)(lVar3 + 0x20) + local_48.yp.m_i.m_i) - *(int *)(lVar3 + 0x18),
                        (*(int *)(lVar3 + 0x1c) + local_48.xp.m_i.m_i) - *(int *)(lVar3 + 0x14));
    uVar6 = QEventPoint::globalPosition();
    auVar18._0_8_ =
         (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa_00;
    auVar18._8_8_ =
         (double)((ulong)extraout_XMM0_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa_00;
    auVar20 = minpd(_DAT_0066f5d0,auVar18);
    auVar19._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
    auVar19._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
    uVar9 = movmskpd(uVar6,auVar19);
    uVar8 = 0x8000000000000000;
    if ((uVar9 & 1) != 0) {
      uVar8 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
    }
    uVar11 = 0x80000000;
    if ((uVar9 & 2) != 0) {
      uVar11 = (ulong)(uint)(int)auVar20._8_8_;
    }
    local_58 = (QPoint)(uVar11 | uVar8);
    cVar5 = QRect::contains(&local_48,SUB81(&local_58,0));
    if (cVar5 != '\0') {
      QWidget::setAttribute(&this->super_QWidget,WA_NoMouseReplay,true);
    }
  }
  if (this_00->eventLoop != (QEventLoop *)0x0) {
    pDVar2 = (this_00->syncAction).wp.d;
    (this_00->syncAction).wp.d = (Data *)0x0;
    (this_00->syncAction).wp.value = (QObject *)0x0;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
  }
  QMenuPrivate::hideUpToMenuBar(this_00);
LAB_00465145:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::mousePressEvent(QMouseEvent *e)
{
    Q_D(QMenu);
    if (d->aboutToHide || d->mouseEventTaken(e))
        return;
    // Workaround for XCB on multiple screens which doesn't have offset. If the menu is open on one screen
    // and mouse clicks on second screen, e->pos() is QPoint(0,0) and the menu doesn't hide. This trick makes
    // possible to hide the menu when mouse clicks on another screen (e->screenPos() returns correct value).
    // Only when mouse clicks in QPoint(0,0) on second screen, the menu doesn't hide.
    if ((e->position().toPoint().isNull() && !e->globalPosition().isNull())
        || !rect().contains(e->position().toPoint())
        || !d->hasMouseMoved(e->globalPosition().toPoint())) {
         if (d->noReplayFor
             && QRect(d->noReplayFor->mapToGlobal(QPoint()), d->noReplayFor->size()).contains(e->globalPosition().toPoint()))
             setAttribute(Qt::WA_NoMouseReplay);
         if (d->eventLoop) // synchronous operation
             d->syncAction = nullptr;
        d->hideUpToMenuBar();
        return;
    }
    QMenuPrivate::mouseDown = this;

    QAction *action = d->actionAt(e->position().toPoint());
    d->setCurrentAction(action, 20);
    update();
}